

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O2

void __thiscall amrex::MultiCutFab::setVal(MultiCutFab *this,Real val)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int i;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int k;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  MFIter mfi;
  Box local_ec;
  Array4<double> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)this,'\0');
  while (local_90.currentIndex < local_90.endIndex) {
    bVar4 = ok(this,&local_90);
    if (bVar4) {
      FabArray<amrex::CutFab>::array<amrex::CutFab,_0>(&local_d0,&this->m_data,&local_90);
      MFIter::fabbox(&local_ec,&local_90);
      auVar3 = _DAT_00601800;
      auVar2 = _DAT_006017f0;
      uVar1 = (this->m_data).super_FabArrayBase.n_comp;
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      uVar5 = local_ec.bigend.vect[0] - local_ec.smallend.vect[0];
      auVar12._4_4_ = 0;
      auVar12._0_4_ = uVar5;
      auVar12._8_4_ = uVar5;
      auVar12._12_4_ = 0;
      auVar12 = auVar12 ^ _DAT_00601800;
      lVar7 = 0;
      for (uVar8 = 0; lVar9 = (long)local_ec.smallend.vect[2], uVar8 != uVar1; uVar8 = uVar8 + 1) {
        for (; (int)lVar9 <= local_ec.bigend.vect[2]; lVar9 = lVar9 + 1) {
          lVar10 = (long)local_d0.p +
                   local_d0.nstride * lVar7 +
                   ((long)local_ec.smallend.vect[1] - (long)local_d0.begin.y) * local_d0.jstride * 8
                   + (lVar9 - local_d0.begin.z) * local_d0.kstride * 8 + (long)local_d0.begin.x * -8
                   + (long)local_ec.smallend.vect[0] * 8 + 8;
          for (lVar6 = (long)local_ec.smallend.vect[1]; lVar6 <= local_ec.bigend.vect[1];
              lVar6 = lVar6 + 1) {
            if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
              uVar11 = 0;
              do {
                auVar13._8_4_ = (int)uVar11;
                auVar13._0_8_ = uVar11;
                auVar13._12_4_ = (int)(uVar11 >> 0x20);
                auVar13 = (auVar13 | auVar2) ^ auVar3;
                if ((bool)(~(auVar12._4_4_ < auVar13._4_4_ ||
                            auVar12._0_4_ < auVar13._0_4_ && auVar13._4_4_ == auVar12._4_4_) & 1)) {
                  *(Real *)(lVar10 + -8 + uVar11 * 8) = val;
                }
                if (auVar13._12_4_ <= auVar12._12_4_ &&
                    (auVar13._8_4_ <= auVar12._8_4_ || auVar13._12_4_ != auVar12._12_4_)) {
                  *(Real *)(lVar10 + uVar11 * 8) = val;
                }
                uVar11 = uVar11 + 2;
              } while (((ulong)uVar5 + 2 & 0xfffffffffffffffe) != uVar11);
            }
            lVar10 = lVar10 + local_d0.jstride * 8;
          }
        }
        lVar7 = lVar7 + 8;
      }
    }
    MFIter::operator++(&local_90);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MultiCutFab::setVal (Real val)
{
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(m_data); mfi.isValid(); ++mfi)
    {
        if (ok(mfi)) {
            Array4<Real> const& a = m_data.array(mfi);
            Box const& b = mfi.fabbox();
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(b, m_data.nComp(), i, j, k, n,
            {
                a(i,j,k,n) = val;
            });
        }
    }
}